

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLaplacian.cpp
# Opt level: O1

void __thiscall
amrex::MLNodeLaplacian::FillBoundaryCoeff(MLNodeLaplacian *this,MultiFab *sigma,Geometry *geom)

{
  GpuArray<amrex::LinOpBCType,_3U> bclo;
  GpuArray<amrex::LinOpBCType,_3U> bchi;
  Periodicity PVar1;
  MFIter mfi;
  MFItInfo mfi_info;
  Box local_8c;
  Array4<double> local_70;
  
  PVar1 = Geometry::periodicity(geom);
  mfi.m_fa._M_t.
  super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>._M_t.
  super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>.
  super__Head_base<0UL,_amrex::FabArrayBase_*,_false>._M_head_impl = PVar1.period.vect._0_8_;
  mfi.fabArray._0_4_ = PVar1.period.vect[2];
  FabArray<amrex::FArrayBox>::FillBoundary<double>
            (&sigma->super_FabArray<amrex::FArrayBox>,(Periodicity *)&mfi,false);
  if ((this->super_MLNodeLinOp).m_coarsening_strategy == Sigma) {
    bclo.arr = *&((this->super_MLNodeLinOp).super_MLLinOp.m_lobc.
                  super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                  .
                  super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_elems;
    bchi.arr = *&((this->super_MLNodeLinOp).super_MLLinOp.m_hibc.
                  super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                  .
                  super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_elems;
    mfi_info.do_tiling = false;
    mfi_info.num_streams = Gpu::Device::max_gpu_streams;
    mfi_info.tilesize.vect[0] = 0;
    mfi_info.tilesize.vect[1] = 0;
    mfi_info.tilesize.vect[2] = 0;
    mfi_info.dynamic = true;
    mfi_info.device_sync = true;
    MFIter::MFIter(&mfi,(FabArrayBase *)sigma,&mfi_info);
    if (mfi.currentIndex < mfi.endIndex) {
      do {
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_70,&sigma->super_FabArray<amrex::FArrayBox>,&mfi);
        BATransformer::operator()
                  (&local_8c,(BATransformer *)(CONCAT44(mfi.fabArray._4_4_,(int)mfi.fabArray) + 8),
                   (Box *)((long)((mfi.index_map)->super_vector<int,_std::allocator<int>_>).
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[mfi.currentIndex] * 0x1c +
                          **(long **)(CONCAT44(mfi.fabArray._4_4_,(int)mfi.fabArray) + 0x50)));
        mlndlap_fillbc_cc<double>(&local_8c,&local_70,&geom->domain,bclo,bchi);
        MFIter::operator++(&mfi);
      } while (mfi.currentIndex < mfi.endIndex);
    }
    MFIter::~MFIter(&mfi);
  }
  return;
}

Assistant:

void
MLNodeLaplacian::FillBoundaryCoeff (MultiFab& sigma, const Geometry& geom)
{
    BL_PROFILE("MLNodeLaplacian::FillBoundaryCoeff()");

    sigma.FillBoundary(geom.periodicity());

    if (m_coarsening_strategy == CoarseningStrategy::Sigma)
    {
        const Box& domain = geom.Domain();
        const auto lobc = LoBC();
        const auto hibc = HiBC();

        MFItInfo mfi_info;
        if (Gpu::notInLaunchRegion()) mfi_info.SetDynamic(true);
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(sigma, mfi_info); mfi.isValid(); ++mfi)
        {
            Array4<Real> const& sfab = sigma.array(mfi);
            mlndlap_fillbc_cc<Real>(mfi.validbox(),sfab,domain,lobc,hibc);
        }
    }
}